

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O1

unsigned_long CalculateBlockCRC32(unsigned_long ulCount,uchar *ucBuffer)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  if (ulCount != 0) {
    do {
      uVar2 = (ulong)(byte)((byte)uVar3 ^ *ucBuffer);
      uVar4 = 9;
      do {
        uVar5 = uVar2 >> 1;
        uVar1 = uVar2 & 1;
        uVar2 = uVar5 ^ 0xedb88320;
        if (uVar1 == 0) {
          uVar2 = uVar5;
        }
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
      ucBuffer = ucBuffer + 1;
      uVar3 = uVar2 ^ uVar3 >> 8;
      ulCount = ulCount - 1;
    } while (ulCount != 0);
  }
  return uVar3;
}

Assistant:

unsigned long CalculateBlockCRC32( unsigned long ulCount, unsigned char* ucBuffer )
{
    unsigned long ulTemp1;
    unsigned long ulTemp2;
    unsigned long ulCRC = 0;
    while ( ulCount-- != 0 )
    {
        ulTemp1 = ( ulCRC >> 8 ) & 0x00FFFFFFL;
        ulTemp2 = CRC32Value( ((int) ulCRC ^ *ucBuffer++ ) & 0xFF );
        ulCRC = ulTemp1 ^ ulTemp2;
    }
    return( ulCRC );
}